

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# locdspnm.cpp
# Opt level: O1

UnicodeString * __thiscall
icu_63::LocaleDisplayNamesImpl::localeDisplayName
          (LocaleDisplayNamesImpl *this,Locale *loc,UnicodeString *result)

{
  char cVar1;
  char cVar2;
  short sVar3;
  ushort uVar4;
  char *pcVar5;
  UBool UVar6;
  ushort uVar7;
  int iVar8;
  int32_t iVar9;
  StringEnumeration *pSVar10;
  undefined4 extraout_var;
  UnicodeString *this_00;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined8 in_RCX;
  undefined7 uVar14;
  Locale *this_01;
  uint32_t buflen;
  int32_t iVar15;
  char cVar16;
  byte bVar17;
  bool bVar18;
  UErrorCode status;
  UnicodeString *local_260;
  UnicodeString *local_258;
  UnicodeString *local_250;
  ICUDataTable *local_248;
  Locale *local_240;
  UnicodeString *local_238;
  UnicodeString *local_230;
  SimpleFormatter *local_228;
  UObject local_220;
  UnicodeString temp;
  UnicodeString resultRemainder;
  UnicodeString resultName;
  UnicodeString temp3;
  UnicodeString temp2;
  char buffer [157];
  char *pcVar11;
  char *localeId;
  
  if (loc->fIsBogus != '\0') {
    UnicodeString::setToBogus(result);
    return result;
  }
  local_220._vptr_UObject = (_func_int **)&PTR__UnicodeString_003e6fd8;
  resultName.super_Replaceable.super_UObject._vptr_UObject = (UObject)&PTR__UnicodeString_003e6fd8;
  resultName.fUnion.fStackFields.fLengthAndFlags = 2;
  pcVar11 = "root";
  if (loc->language[0] != '\0') {
    pcVar11 = loc->language;
  }
  local_250 = (UnicodeString *)loc->script;
  local_258 = (UnicodeString *)loc->country;
  pcVar5 = loc->baseName;
  local_228 = (SimpleFormatter *)(long)loc->variantBegin;
  cVar1 = loc->script[0];
  cVar2 = loc->country[0];
  uVar14 = (undefined7)((ulong)in_RCX >> 8);
  local_260 = (UnicodeString *)CONCAT44(local_260._4_4_,(int)CONCAT71(uVar14,cVar1 != '\0'));
  local_248 = (ICUDataTable *)CONCAT44(local_248._4_4_,(int)CONCAT71(uVar14,cVar2 != '\0'));
  local_238 = (UnicodeString *)CONCAT71(local_238._1_7_,pcVar5[(long)local_228]);
  local_240 = loc;
  local_230 = result;
  cVar16 = cVar1 != '\0';
  bVar17 = cVar2 != '\0';
  if (this->dialectHandling != ULDN_DIALECT_NAMES) goto LAB_0028bcca;
  if (cVar1 != '\0' && cVar2 != '\0') {
    ncat(buffer,(uint32_t)loc,pcVar11,"_",local_250,"_",local_258,0);
    loc = (Locale *)buffer;
    localeIdName(this,(char *)loc,&resultName);
    if ((resultName.fUnion.fStackFields.fLengthAndFlags & 1U) == 0) {
      cVar16 = '\0';
      bVar17 = 0;
      goto LAB_0028bcca;
    }
  }
  buflen = (uint32_t)loc;
  if (cVar1 == '\0') {
    if (cVar2 != '\0') goto LAB_0028bc75;
    bVar17 = (byte)local_248;
  }
  else {
    ncat(buffer,buflen,pcVar11,"_",local_250,0);
    localeId = buffer;
    localeIdName(this,localeId,&resultName);
    buflen = (uint32_t)localeId;
    cVar16 = '\0';
    if ((resultName.fUnion.fStackFields.fLengthAndFlags & 1U) != 0) {
      cVar16 = (char)local_260;
    }
    if ((resultName.fUnion.fStackFields.fLengthAndFlags._0_1_ & 1 & cVar2 != '\0') == 0) {
      bVar17 = (byte)local_248;
      goto LAB_0028bcca;
    }
LAB_0028bc75:
    ncat(buffer,buflen,pcVar11,"_",local_258,0);
    localeIdName(this,buffer,&resultName);
    bVar17 = (byte)local_248 & resultName.fUnion.fStackFields.fLengthAndFlags._0_1_;
  }
  cVar16 = (char)local_260;
LAB_0028bcca:
  this_01 = local_240;
  if ((ushort)resultName.fUnion.fStackFields.fLengthAndFlags < 0x20 ||
      (resultName.fUnion.fStackFields.fLengthAndFlags & 1U) != 0) {
    localeIdName(this,pcVar11,&resultName);
  }
  resultRemainder.super_Replaceable.super_UObject._vptr_UObject =
       (UObject)(UObject)local_220._vptr_UObject;
  resultRemainder.fUnion.fStackFields.fLengthAndFlags = 2;
  temp.super_Replaceable.super_UObject._vptr_UObject = (UObject)(UObject)local_220._vptr_UObject;
  temp.fUnion.fStackFields.fLengthAndFlags = 2;
  status = U_ZERO_ERROR;
  if (cVar16 != '\0') {
    scriptDisplayName(this,(char *)local_250,&temp,'\x01');
    uVar12 = temp.fUnion.fFields.fLength;
    if (-1 < temp.fUnion.fStackFields.fLengthAndFlags) {
      uVar12 = (int)temp.fUnion.fStackFields.fLengthAndFlags >> 5;
    }
    UnicodeString::doAppend(&resultRemainder,&temp,0,uVar12);
  }
  if (bVar17 != 0) {
    regionDisplayName(this,(char *)local_258,&temp,'\x01');
    appendWithSep(this,&resultRemainder,&temp);
  }
  if ((char)local_238 != '\0') {
    ICUDataTable::get(&this->langData,"Variants",(char *)0x0,pcVar5 + (long)local_228,&temp);
    appendWithSep(this,&resultRemainder,&temp);
  }
  uVar12 = resultRemainder.fUnion.fFields.fLength;
  if (-1 < resultRemainder.fUnion.fStackFields.fLengthAndFlags) {
    uVar12 = (int)resultRemainder.fUnion.fStackFields.fLengthAndFlags >> 5;
  }
  sVar3 = (this->formatOpenParen).fUnion.fStackFields.fLengthAndFlags;
  if (sVar3 < 0) {
    iVar15 = (this->formatOpenParen).fUnion.fFields.fLength;
  }
  else {
    iVar15 = (int)sVar3 >> 5;
  }
  local_250 = &this->formatOpenParen;
  local_258 = &this->formatReplaceOpenParen;
  sVar3 = (this->formatReplaceOpenParen).fUnion.fStackFields.fLengthAndFlags;
  if (sVar3 < 0) {
    iVar9 = (this->formatReplaceOpenParen).fUnion.fFields.fLength;
  }
  else {
    iVar9 = (int)sVar3 >> 5;
  }
  UnicodeString::findAndReplace(&resultRemainder,0,uVar12,local_250,0,iVar15,local_258,0,iVar9);
  if (-1 < resultRemainder.fUnion.fStackFields.fLengthAndFlags) {
    resultRemainder.fUnion.fFields.fLength =
         (int)resultRemainder.fUnion.fStackFields.fLengthAndFlags >> 5;
  }
  sVar3 = (this->formatCloseParen).fUnion.fStackFields.fLengthAndFlags;
  if (sVar3 < 0) {
    iVar15 = (this->formatCloseParen).fUnion.fFields.fLength;
  }
  else {
    iVar15 = (int)sVar3 >> 5;
  }
  local_238 = &this->formatCloseParen;
  local_260 = &this->formatReplaceCloseParen;
  sVar3 = (this->formatReplaceCloseParen).fUnion.fStackFields.fLengthAndFlags;
  if (sVar3 < 0) {
    iVar9 = (this->formatReplaceCloseParen).fUnion.fFields.fLength;
  }
  else {
    iVar9 = (int)sVar3 >> 5;
  }
  UnicodeString::findAndReplace
            (&resultRemainder,0,resultRemainder.fUnion.fFields.fLength,local_238,0,iVar15,local_260,
             0,iVar9);
  pSVar10 = Locale::createKeywords(this_01,&status);
  if ((pSVar10 != (StringEnumeration *)0x0) && (status < U_ILLEGAL_ARGUMENT_ERROR)) {
    temp2.super_Replaceable.super_UObject._vptr_UObject = (UObject)(UObject)local_220._vptr_UObject;
    temp2.fUnion.fStackFields.fLengthAndFlags = 2;
    local_248 = &this->langData;
    local_228 = &this->keyTypeFormat;
    while( true ) {
      iVar8 = (*(pSVar10->super_UObject)._vptr_UObject[5])(pSVar10,0,&status);
      pcVar11 = (char *)CONCAT44(extraout_var,iVar8);
      if (pcVar11 == (char *)0x0) break;
      buffer[0] = '\0';
      Locale::getKeywordValue(this_01,pcVar11,buffer,100,&status);
      if ((U_ZERO_ERROR < status) || (status == U_STRING_NOT_TERMINATED_WARNING)) {
        UnicodeString::~UnicodeString(&temp2);
        goto LAB_0028c3e7;
      }
      ICUDataTable::get(local_248,"Keys",(char *)0x0,pcVar11,&temp);
      uVar12 = temp.fUnion.fFields.fLength;
      if (-1 < temp.fUnion.fStackFields.fLengthAndFlags) {
        uVar12 = (int)temp.fUnion.fStackFields.fLengthAndFlags >> 5;
      }
      sVar3 = (this->formatOpenParen).fUnion.fStackFields.fLengthAndFlags;
      if (sVar3 < 0) {
        iVar15 = (this->formatOpenParen).fUnion.fFields.fLength;
      }
      else {
        iVar15 = (int)sVar3 >> 5;
      }
      sVar3 = (this->formatReplaceOpenParen).fUnion.fStackFields.fLengthAndFlags;
      if (sVar3 < 0) {
        iVar9 = (this->formatReplaceOpenParen).fUnion.fFields.fLength;
      }
      else {
        iVar9 = (int)sVar3 >> 5;
      }
      UnicodeString::findAndReplace(&temp,0,uVar12,local_250,0,iVar15,local_258,0,iVar9);
      uVar12 = temp.fUnion.fFields.fLength;
      if (-1 < temp.fUnion.fStackFields.fLengthAndFlags) {
        uVar12 = (int)temp.fUnion.fStackFields.fLengthAndFlags >> 5;
      }
      sVar3 = (this->formatCloseParen).fUnion.fStackFields.fLengthAndFlags;
      if (sVar3 < 0) {
        iVar15 = (this->formatCloseParen).fUnion.fFields.fLength;
      }
      else {
        iVar15 = (int)sVar3 >> 5;
      }
      sVar3 = (this->formatReplaceCloseParen).fUnion.fStackFields.fLengthAndFlags;
      if (sVar3 < 0) {
        iVar9 = (this->formatReplaceCloseParen).fUnion.fFields.fLength;
      }
      else {
        iVar9 = (int)sVar3 >> 5;
      }
      UnicodeString::findAndReplace(&temp,0,uVar12,local_238,0,iVar15,local_260,0,iVar9);
      keyValueDisplayName(this,pcVar11,buffer,&temp2,'\x01');
      uVar12 = temp2.fUnion.fFields.fLength;
      if (-1 < temp2.fUnion.fStackFields.fLengthAndFlags) {
        uVar12 = (int)temp2.fUnion.fStackFields.fLengthAndFlags >> 5;
      }
      sVar3 = (this->formatOpenParen).fUnion.fStackFields.fLengthAndFlags;
      if (sVar3 < 0) {
        iVar15 = (this->formatOpenParen).fUnion.fFields.fLength;
      }
      else {
        iVar15 = (int)sVar3 >> 5;
      }
      sVar3 = (this->formatReplaceOpenParen).fUnion.fStackFields.fLengthAndFlags;
      if (sVar3 < 0) {
        iVar9 = (this->formatReplaceOpenParen).fUnion.fFields.fLength;
      }
      else {
        iVar9 = (int)sVar3 >> 5;
      }
      UnicodeString::findAndReplace(&temp2,0,uVar12,local_250,0,iVar15,local_258,0,iVar9);
      uVar12 = temp2.fUnion.fFields.fLength;
      if (-1 < temp2.fUnion.fStackFields.fLengthAndFlags) {
        uVar12 = (int)temp2.fUnion.fStackFields.fLengthAndFlags >> 5;
      }
      sVar3 = (this->formatCloseParen).fUnion.fStackFields.fLengthAndFlags;
      if (sVar3 < 0) {
        iVar15 = (this->formatCloseParen).fUnion.fFields.fLength;
      }
      else {
        iVar15 = (int)sVar3 >> 5;
      }
      sVar3 = (this->formatReplaceCloseParen).fUnion.fStackFields.fLengthAndFlags;
      if (sVar3 < 0) {
        iVar9 = (this->formatReplaceCloseParen).fUnion.fFields.fLength;
      }
      else {
        iVar9 = (int)sVar3 >> 5;
      }
      UnicodeString::findAndReplace(&temp2,0,uVar12,local_238,0,iVar15,local_260,0,iVar9);
      UnicodeString::UnicodeString(&temp3,buffer,-1,kInvariant);
      if ((temp2.fUnion.fStackFields.fLengthAndFlags & 1U) == 0) {
        uVar12 = temp2.fUnion.fFields.fLength;
        if (-1 < temp2.fUnion.fStackFields.fLengthAndFlags) {
          uVar12 = (int)temp2.fUnion.fStackFields.fLengthAndFlags >> 5;
        }
        uVar13 = temp3.fUnion.fFields.fLength;
        if (-1 < temp3.fUnion.fStackFields.fLengthAndFlags) {
          uVar13 = (int)temp3.fUnion.fStackFields.fLengthAndFlags >> 5;
        }
        bVar18 = false;
        if ((((int)temp3.fUnion.fStackFields.fLengthAndFlags & 1U) == 0) &&
           (bVar18 = false, uVar12 == uVar13)) {
          UVar6 = UnicodeString::doEquals(&temp2,&temp3,uVar12);
          bVar18 = UVar6 != '\0';
        }
      }
      else {
        bVar18 = (bool)(temp3.fUnion.fStackFields.fLengthAndFlags._0_1_ & 1);
      }
      UnicodeString::~UnicodeString(&temp3);
      if (bVar18 == false) {
        appendWithSep(this,&resultRemainder,&temp2);
        this_01 = local_240;
      }
      else {
        UnicodeString::UnicodeString(&temp3,pcVar11,-1,kInvariant);
        if ((temp.fUnion.fStackFields.fLengthAndFlags & 1U) == 0) {
          uVar12 = temp.fUnion.fFields.fLength;
          if (-1 < temp.fUnion.fStackFields.fLengthAndFlags) {
            uVar12 = (int)temp.fUnion.fStackFields.fLengthAndFlags >> 5;
          }
          uVar13 = temp3.fUnion.fFields.fLength;
          if (-1 < temp3.fUnion.fStackFields.fLengthAndFlags) {
            uVar13 = (int)temp3.fUnion.fStackFields.fLengthAndFlags >> 5;
          }
          bVar18 = false;
          if ((((int)temp3.fUnion.fStackFields.fLengthAndFlags & 1U) == 0) && (uVar12 == uVar13)) {
            UVar6 = UnicodeString::doEquals(&temp,&temp3,uVar12);
            bVar18 = UVar6 != '\0';
          }
        }
        else {
          bVar18 = (bool)(temp3.fUnion.fStackFields.fLengthAndFlags._0_1_ & 1);
        }
        UnicodeString::~UnicodeString(&temp3);
        if (bVar18 == false) {
          temp3.super_Replaceable.super_UObject._vptr_UObject =
               (UObject)(UObject)local_220._vptr_UObject;
          temp3.fUnion.fStackFields.fLengthAndFlags = 2;
          SimpleFormatter::format(local_228,&temp,&temp2,&temp3,&status);
          this_01 = local_240;
          appendWithSep(this,&resultRemainder,&temp3);
          UnicodeString::~UnicodeString(&temp3);
        }
        else {
          appendWithSep(this,&resultRemainder,&temp);
          this_01 = local_240;
          temp3.super_Replaceable.super_UObject._vptr_UObject._0_2_ = 0x3d;
          this_00 = UnicodeString::doAppend(&resultRemainder,(UChar *)&temp3,0,1);
          uVar12 = temp2.fUnion.fFields.fLength;
          if (-1 < temp2.fUnion.fStackFields.fLengthAndFlags) {
            uVar12 = (int)temp2.fUnion.fStackFields.fLengthAndFlags >> 5;
          }
          UnicodeString::doAppend(this_00,&temp2,0,uVar12);
        }
      }
    }
    UnicodeString::~UnicodeString(&temp2);
  }
  if ((ushort)resultRemainder.fUnion.fStackFields.fLengthAndFlags < 0x20) {
    UnicodeString::operator=(local_230,&resultName);
  }
  else {
    uVar4 = (local_230->fUnion).fStackFields.fLengthAndFlags;
    uVar7 = 2;
    if ((uVar4 & 1) == 0) {
      uVar7 = uVar4 & 0x1e;
    }
    (local_230->fUnion).fStackFields.fLengthAndFlags = uVar7;
    SimpleFormatter::format(&this->format,&resultName,&resultRemainder,local_230,&status);
  }
  adjustForUsageAndContext(this,kCapContextUsageLanguage,local_230);
LAB_0028c3e7:
  if (pSVar10 != (StringEnumeration *)0x0) {
    (*(pSVar10->super_UObject)._vptr_UObject[1])(pSVar10);
  }
  UnicodeString::~UnicodeString(&temp);
  UnicodeString::~UnicodeString(&resultRemainder);
  UnicodeString::~UnicodeString(&resultName);
  return local_230;
}

Assistant:

UnicodeString&
LocaleDisplayNamesImpl::localeDisplayName(const Locale& loc,
                                          UnicodeString& result) const {
  if (loc.isBogus()) {
    result.setToBogus();
    return result;
  }
  UnicodeString resultName;

  const char* lang = loc.getLanguage();
  if (uprv_strlen(lang) == 0) {
    lang = "root";
  }
  const char* script = loc.getScript();
  const char* country = loc.getCountry();
  const char* variant = loc.getVariant();

  UBool hasScript = uprv_strlen(script) > 0;
  UBool hasCountry = uprv_strlen(country) > 0;
  UBool hasVariant = uprv_strlen(variant) > 0;

  if (dialectHandling == ULDN_DIALECT_NAMES) {
    char buffer[ULOC_FULLNAME_CAPACITY];
    do { // loop construct is so we can break early out of search
      if (hasScript && hasCountry) {
        ncat(buffer, ULOC_FULLNAME_CAPACITY, lang, "_", script, "_", country, (char *)0);
        localeIdName(buffer, resultName);
        if (!resultName.isBogus()) {
          hasScript = FALSE;
          hasCountry = FALSE;
          break;
        }
      }
      if (hasScript) {
        ncat(buffer, ULOC_FULLNAME_CAPACITY, lang, "_", script, (char *)0);
        localeIdName(buffer, resultName);
        if (!resultName.isBogus()) {
          hasScript = FALSE;
          break;
        }
      }
      if (hasCountry) {
        ncat(buffer, ULOC_FULLNAME_CAPACITY, lang, "_", country, (char*)0);
        localeIdName(buffer, resultName);
        if (!resultName.isBogus()) {
          hasCountry = FALSE;
          break;
        }
      }
    } while (FALSE);
  }
  if (resultName.isBogus() || resultName.isEmpty()) {
    localeIdName(lang, resultName);
  }

  UnicodeString resultRemainder;
  UnicodeString temp;
  UErrorCode status = U_ZERO_ERROR;

  if (hasScript) {
    resultRemainder.append(scriptDisplayName(script, temp, TRUE));
  }
  if (hasCountry) {
    appendWithSep(resultRemainder, regionDisplayName(country, temp, TRUE));
  }
  if (hasVariant) {
    appendWithSep(resultRemainder, variantDisplayName(variant, temp, TRUE));
  }
  resultRemainder.findAndReplace(formatOpenParen, formatReplaceOpenParen);
  resultRemainder.findAndReplace(formatCloseParen, formatReplaceCloseParen);

  LocalPointer<StringEnumeration> e(loc.createKeywords(status));
  if (e.isValid() && U_SUCCESS(status)) {
    UnicodeString temp2;
    char value[ULOC_KEYWORD_AND_VALUES_CAPACITY]; // sigh, no ULOC_VALUE_CAPACITY
    const char* key;
    while ((key = e->next((int32_t *)0, status)) != NULL) {
      value[0] = 0;
      loc.getKeywordValue(key, value, ULOC_KEYWORD_AND_VALUES_CAPACITY, status);
      if (U_FAILURE(status) || status == U_STRING_NOT_TERMINATED_WARNING) {
        return result;
      }
      keyDisplayName(key, temp, TRUE);
      temp.findAndReplace(formatOpenParen, formatReplaceOpenParen);
      temp.findAndReplace(formatCloseParen, formatReplaceCloseParen);
      keyValueDisplayName(key, value, temp2, TRUE);
      temp2.findAndReplace(formatOpenParen, formatReplaceOpenParen);
      temp2.findAndReplace(formatCloseParen, formatReplaceCloseParen);
      if (temp2 != UnicodeString(value, -1, US_INV)) {
        appendWithSep(resultRemainder, temp2);
      } else if (temp != UnicodeString(key, -1, US_INV)) {
        UnicodeString temp3;
        keyTypeFormat.format(temp, temp2, temp3, status);
        appendWithSep(resultRemainder, temp3);
      } else {
        appendWithSep(resultRemainder, temp)
          .append((UChar)0x3d /* = */)
          .append(temp2);
      }
    }
  }

  if (!resultRemainder.isEmpty()) {
    format.format(resultName, resultRemainder, result.remove(), status);
    return adjustForUsageAndContext(kCapContextUsageLanguage, result);
  }

  result = resultName;
  return adjustForUsageAndContext(kCapContextUsageLanguage, result);
}